

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParameterTests.cpp
# Opt level: O3

void addEps(NeuralNetwork *nn,OptimizerTypeCase optimizerType,double defaultValue,double minValue,
           double maxValue)

{
  NetworkUpdateParameters *this;
  Optimizer *this_00;
  AdamOptimizer *this_01;
  DoubleParameter *this_02;
  DoubleRange *this_03;
  
  this = nn->updateparams_;
  if (this == (NetworkUpdateParameters *)0x0) {
    this = (NetworkUpdateParameters *)operator_new(0x50);
    CoreML::Specification::NetworkUpdateParameters::NetworkUpdateParameters(this);
    nn->updateparams_ = this;
  }
  this_00 = this->optimizer_;
  if (this_00 == (Optimizer *)0x0) {
    this_00 = (Optimizer *)operator_new(0x20);
    CoreML::Specification::Optimizer::Optimizer(this_00);
    this->optimizer_ = this_00;
  }
  if (this_00->_oneof_case_[0] == 0xb) {
    this_01 = (this_00->OptimizerType_).adamoptimizer_;
  }
  else {
    CoreML::Specification::Optimizer::clear_OptimizerType(this_00);
    this_00->_oneof_case_[0] = 0xb;
    this_01 = (AdamOptimizer *)operator_new(0x40);
    CoreML::Specification::AdamOptimizer::AdamOptimizer(this_01);
    (this_00->OptimizerType_).adamoptimizer_ = this_01;
  }
  this_02 = this_01->eps_;
  if (this_02 == (DoubleParameter *)0x0) {
    this_02 = (DoubleParameter *)operator_new(0x28);
    CoreML::Specification::DoubleParameter::DoubleParameter(this_02);
    this_01->eps_ = this_02;
  }
  this_02->defaultvalue_ = defaultValue;
  if (this_02->_oneof_case_[0] == 10) {
    this_03 = (this_02->AllowedValues_).range_;
  }
  else {
    CoreML::Specification::DoubleParameter::clear_AllowedValues(this_02);
    this_02->_oneof_case_[0] = 10;
    this_03 = (DoubleRange *)operator_new(0x28);
    CoreML::Specification::DoubleRange::DoubleRange(this_03);
    (this_02->AllowedValues_).range_ = this_03;
  }
  this_03->minvalue_ = minValue;
  this_03->maxvalue_ = maxValue;
  return;
}

Assistant:

void addEps(Specification::NeuralNetwork *nn, Specification::Optimizer::OptimizerTypeCase optimizerType, double defaultValue, double minValue, double maxValue) {
    
    auto updateParameters = nn->mutable_updateparams();
    auto optimizer = updateParameters->mutable_optimizer();
    auto realOptimizer = (::CoreML::Specification::AdamOptimizer*)NULL;
    
    switch (optimizerType) {
        case Specification::Optimizer::kAdamOptimizer:
            realOptimizer = optimizer->mutable_adamoptimizer();
            break;
        default:
            break;
    }
    
    auto eps = realOptimizer->mutable_eps();
    
    eps->set_defaultvalue(defaultValue);
    
    auto doubleRange = eps->mutable_range();
    doubleRange->set_minvalue(minValue);
    doubleRange->set_maxvalue(maxValue);
}